

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O2

void __thiscall
Assimp::SMDImporter::ParseVASection(SMDImporter *this,char *szCurrent,char **szCurrentOut)

{
  uint uVar1;
  bool bVar2;
  SMDImporter *this_00;
  int iVar3;
  ulong uVar4;
  char *szCurrent_local;
  vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_> *local_108;
  char **local_100;
  int iTime;
  
  local_108 = &this->asTriangles;
  uVar4 = 0;
  szCurrent_local = szCurrent;
  local_100 = szCurrentOut;
  while( true ) {
    bVar2 = SkipSpacesAndLineEnd(this,szCurrent_local,&szCurrent_local);
    iVar3 = (int)uVar4;
    if ((!bVar2) || (bVar2 = TokenMatch<char_const>(&szCurrent_local,"end",3), bVar2)) break;
    this_00 = (SMDImporter *)&szCurrent_local;
    bVar2 = TokenMatch<char_const>(&szCurrent_local,"time",4);
    if (bVar2) {
      iTime = 0;
      bVar2 = ParseSignedInt(this_00,szCurrent_local,&szCurrent_local,&iTime);
      if ((!bVar2) || (this->configFrameID != iTime)) break;
      SkipLine(this,szCurrent_local,&szCurrent_local);
    }
    else {
      if (iVar3 == 0) {
        SMD::Face::Face((Face *)&iTime);
        std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>::
        emplace_back<Assimp::SMD::Face>(local_108,(Face *)&iTime);
        SMD::Face::~Face((Face *)&iTime);
      }
      uVar1 = iVar3 + 1U;
      if (iVar3 + 1U == 3) {
        uVar1 = 0;
      }
      uVar4 = (ulong)uVar1;
      ParseVertex(this,szCurrent_local,&szCurrent_local,
                  (Vertex *)
                  ((long)(this->asTriangles).
                         super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>.
                         _M_impl.super__Vector_impl_data._M_finish + uVar4 * 0x40 + -0xc0),true);
    }
  }
  if ((iVar3 != 2) &&
     ((this->asTriangles).super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->asTriangles).super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>::pop_back(local_108);
  }
  SkipSpacesAndLineEnd(this,szCurrent_local,&szCurrent_local);
  *local_100 = szCurrent_local;
  return;
}

Assistant:

void SMDImporter::ParseVASection(const char* szCurrent, const char** szCurrentOut) {
    unsigned int iCurIndex = 0;
    for ( ;; ) {
        if (!SkipSpacesAndLineEnd(szCurrent,&szCurrent)) {
            break;
        }

        // "end\n" - Ends the "vertexanimation" section
        if (TokenMatch(szCurrent,"end",3)) {
            break;
        }

        // "time <n>\n"
        if (TokenMatch(szCurrent,"time",4)) {
            // NOTE: The doc says that time values COULD be negative ...
            // NOTE2: this is the shape key -> valve docs
            int iTime = 0;
            if(!ParseSignedInt(szCurrent,&szCurrent,iTime) || configFrameID != (unsigned int)iTime) {
                break;
            }
            SkipLine(szCurrent,&szCurrent);
        } else {
            if(0 == iCurIndex) {
                asTriangles.push_back(SMD::Face());
            }
            if (++iCurIndex == 3) {
                iCurIndex = 0;
            }
            ParseVertex(szCurrent,&szCurrent,asTriangles.back().avVertices[iCurIndex],true);
        }
    }

    if (iCurIndex != 2 && !asTriangles.empty()) {
        // we want to no degenerates, so throw this triangle away
        asTriangles.pop_back();
    }

    SkipSpacesAndLineEnd(szCurrent,&szCurrent);
    *szCurrentOut = szCurrent;
}